

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

Class * __thiscall
Population::crossover(Class *__return_storage_ptr__,Population *this,Class *class1,Class *class2)

{
  size_t sVar1;
  undefined4 uVar2;
  int iVar3;
  result_type_conflict1 rVar4;
  Class *pCVar5;
  param_type local_30;
  
  iVar3 = Group::counter + 1;
  (__return_storage_ptr__->group).id = Group::counter;
  Group::counter = iVar3;
  (__return_storage_ptr__->group).name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->group).name.field_2;
  (__return_storage_ptr__->group).name._M_string_length = 0;
  (__return_storage_ptr__->group).name.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->group).subjects.super__Vector_base<Subject,_std::allocator<Subject>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->group).subjects.super__Vector_base<Subject,_std::allocator<Subject>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->group).subjects.super__Vector_base<Subject,_std::allocator<Subject>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->subject).name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->subject).name.field_2;
  (__return_storage_ptr__->subject).name._M_string_length = 0;
  (__return_storage_ptr__->subject).name.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->subject).teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->subject).teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->subject).teachers.super__Vector_base<Teacher,_std::allocator<Teacher>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->teacher).name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->teacher).name.field_2;
  (__return_storage_ptr__->teacher).name._M_string_length = 0;
  (__return_storage_ptr__->teacher).name.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->time).day._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->time).day.field_2;
  (__return_storage_ptr__->time).day._M_string_length = 0;
  (__return_storage_ptr__->time).day.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->time);
  (__return_storage_ptr__->time).number = (class1->time).number;
  Group::operator=(&__return_storage_ptr__->group,&class2->group);
  local_30._M_a = 0;
  local_30._M_b = 1;
  random_engine();
  rVar4 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_30,&random_engine::smt,&local_30);
  pCVar5 = class1;
  if (rVar4 == 0) {
    pCVar5 = class2;
  }
  uVar2 = *(undefined4 *)&(pCVar5->room).field_0x4;
  sVar1 = (pCVar5->room).capacity;
  (__return_storage_ptr__->room).number = (pCVar5->room).number;
  *(undefined4 *)&(__return_storage_ptr__->room).field_0x4 = uVar2;
  (__return_storage_ptr__->room).capacity = sVar1;
  local_30._M_a = 0;
  local_30._M_b = 1;
  random_engine();
  std::uniform_int_distribution<int>::operator()
            ((uniform_int_distribution<int> *)&local_30,&random_engine::smt,&local_30);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->teacher);
  local_30._M_a = 0;
  local_30._M_b = 1;
  random_engine();
  rVar4 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_30,&random_engine::smt,&local_30);
  if (rVar4 == 0) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->subject);
    std::vector<Teacher,_std::allocator<Teacher>_>::operator=
              (&(__return_storage_ptr__->subject).teachers,&(class2->subject).teachers);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->subject);
    std::vector<Teacher,_std::allocator<Teacher>_>::operator=
              (&(__return_storage_ptr__->subject).teachers,&(class1->subject).teachers);
  }
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->teacher);
  return __return_storage_ptr__;
}

Assistant:

Class Population::crossover(const Class& class1, const Class& class2) const {
    Class res;
    res.time = class1.time;
    res.group = class2.group;
    if (RandomBool()) {
        res.room = class1.room;
    } else {
        res.room = class2.room;
    }

    if (RandomBool()) {
        res.teacher = class1.teacher;
    } else {
        res.teacher = class2.teacher;
    }

    if (RandomBool()) {
        res.subject = class1.subject;
        res.teacher = class1.teacher;
    } else {
        res.subject = class2.subject;
        res.teacher = class2.teacher;
    }

    return res;
}